

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O0

void __thiscall
Storage::Disk::MacintoshIMG::MacintoshIMG
          (MacintoshIMG *this,string *file_name,FixedType type,size_t offset,size_t length)

{
  undefined4 *puVar1;
  size_t length_local;
  size_t offset_local;
  FixedType type_local;
  string *file_name_local;
  MacintoshIMG *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MacintoshIMG_00caa580;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->tags_);
  this->is_diskCopy_file_ = false;
  std::mutex::mutex(&this->buffer_mutex_);
  this->raw_offset_ = 0;
  if (type != GCR) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0xfffffffe;
    __cxa_throw(puVar1,&Error::typeinfo,0);
  }
  construct_raw_gcr(this,offset,length);
  return;
}

Assistant:

MacintoshIMG::MacintoshIMG(const std::string &file_name, FixedType type, size_t offset, size_t length) :
	file_(file_name) {

	switch(type) {
		case FixedType::GCR:
			construct_raw_gcr(offset, length);
		break;
		default:
			throw Error::InvalidFormat;
	}
}